

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_test.cpp
# Opt level: O0

int main(void)

{
  ct_constant<8L> *t;
  ostream *poVar1;
  void *pvVar2;
  rt_variable<viennamath::rt_expression_interface<double>_> *other;
  numeric_type nVar3;
  rt_expr<viennamath::rt_expression_interface<double>_> local_2d8;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> local_2d0;
  type local_2b8;
  type local_298;
  rt_expr<viennamath::rt_expression_interface<double>_> local_278;
  type local_270;
  type local_250;
  type local_230;
  type local_210;
  type local_1f0;
  type local_1d0;
  rt_expr<viennamath::rt_expression_interface<double>_> local_1b0;
  rt_expr<viennamath::rt_expression_interface<double>_> local_1a8;
  rt_expr<viennamath::rt_expression_interface<double>_> local_1a0;
  type local_198;
  rt_expr<viennamath::rt_expression_interface<double>_> local_178;
  rt_variable<viennamath::rt_expression_interface<double>_> local_170;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  rt_expr<viennamath::rt_expression_interface<double>_> local_f8;
  expr e;
  rt_expr<viennamath::rt_expression_interface<double>_> local_d0;
  expr e3;
  rt_expr<viennamath::rt_expression_interface<double>_> local_a8;
  expr e2;
  rt_expr<viennamath::rt_expression_interface<double>_> local_80;
  expr e1;
  undefined1 local_70 [7];
  ct_constant<8L> c8;
  rt_constant<long,_viennamath::rt_expression_interface<double>_> c6;
  rt_constant<double,_viennamath::rt_expression_interface<double>_> c4;
  variable z;
  undefined1 local_30 [8];
  variable y;
  variable x;
  
  viennamath::rt_variable<viennamath::rt_expression_interface<double>_>::rt_variable
            ((rt_variable<viennamath::rt_expression_interface<double>_> *)&y.id_,0);
  viennamath::rt_variable<viennamath::rt_expression_interface<double>_>::rt_variable
            ((rt_variable<viennamath::rt_expression_interface<double>_> *)local_30,1);
  viennamath::rt_variable<viennamath::rt_expression_interface<double>_>::rt_variable
            ((rt_variable<viennamath::rt_expression_interface<double>_> *)&c4.s,2);
  viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>::rt_constant
            ((rt_constant<double,_viennamath::rt_expression_interface<double>_> *)&c6.s,4.0);
  viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>::rt_constant
            ((rt_constant<long,_viennamath::rt_expression_interface<double>_> *)local_70,6);
  viennamath::ct_constant<8L>::ct_constant((ct_constant<8L> *)((long)&e1.rt_expr_._M_ptr + 7));
  viennamath::operator+
            ((type *)&e2,(rt_variable<viennamath::rt_expression_interface<double>_> *)&y.id_,
             (rt_variable<viennamath::rt_expression_interface<double>_> *)local_30);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            (&local_80,(rt_binary_expr<viennamath::rt_expression_interface<double>_> *)&e2);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            ((rt_binary_expr<viennamath::rt_expression_interface<double>_> *)&e2);
  viennamath::operator+
            ((type *)&e3,(rt_constant<double,_viennamath::rt_expression_interface<double>_> *)&c6.s,
             (ct_constant<8L> *)((long)&e1.rt_expr_._M_ptr + 7));
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            (&local_a8,(rt_binary_expr<viennamath::rt_expression_interface<double>_> *)&e3);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            ((rt_binary_expr<viennamath::rt_expression_interface<double>_> *)&e3);
  viennamath::operator+((type *)&e,&local_80,&local_a8);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            (&local_d0,(rt_binary_expr<viennamath::rt_expression_interface<double>_> *)&e);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            ((rt_binary_expr<viennamath::rt_expression_interface<double>_> *)&e);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr(&local_f8);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            (&local_f8,&local_80,&local_a8);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>>
            (&local_f8,&local_80,(rt_variable<viennamath::rt_expression_interface<double>_> *)&y.id_
            );
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>>
            (&local_f8,&local_80,
             (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)&c6.s);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>>
            (&local_f8,&local_80,
             (rt_constant<long,_viennamath::rt_expression_interface<double>_> *)local_70);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>>
            (&local_f8,&local_80,(ct_constant<8L> *)((long)&e1.rt_expr_._M_ptr + 7));
  local_100 = 2.7172;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>,double>
            (&local_f8,&local_80,&local_100);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            (&local_f8,(rt_variable<viennamath::rt_expression_interface<double>_> *)&y.id_,&local_a8
            );
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>>
            (&local_f8,(rt_variable<viennamath::rt_expression_interface<double>_> *)&y.id_,
             (rt_variable<viennamath::rt_expression_interface<double>_> *)&y.id_);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>>
            (&local_f8,(rt_variable<viennamath::rt_expression_interface<double>_> *)&y.id_,
             (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)&c6.s);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>>
            (&local_f8,(rt_variable<viennamath::rt_expression_interface<double>_> *)&y.id_,
             (rt_constant<long,_viennamath::rt_expression_interface<double>_> *)local_70);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>>
            (&local_f8,(rt_variable<viennamath::rt_expression_interface<double>_> *)&y.id_,
             (ct_constant<8L> *)((long)&e1.rt_expr_._M_ptr + 7));
  local_108 = 2.7172;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,double>
            (&local_f8,(rt_variable<viennamath::rt_expression_interface<double>_> *)&y.id_,
             &local_108);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            (&local_f8,(rt_variable<viennamath::rt_expression_interface<double>_> *)local_30,
             &local_a8);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>>
            (&local_f8,(rt_variable<viennamath::rt_expression_interface<double>_> *)local_30,
             (rt_variable<viennamath::rt_expression_interface<double>_> *)&y.id_);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>>
            (&local_f8,(rt_variable<viennamath::rt_expression_interface<double>_> *)local_30,
             (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)&c6.s);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>>
            (&local_f8,(rt_variable<viennamath::rt_expression_interface<double>_> *)local_30,
             (rt_constant<long,_viennamath::rt_expression_interface<double>_> *)local_70);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>>
            (&local_f8,(rt_variable<viennamath::rt_expression_interface<double>_> *)local_30,
             (ct_constant<8L> *)((long)&e1.rt_expr_._M_ptr + 7));
  local_110 = 2.7172;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,double>
            (&local_f8,(rt_variable<viennamath::rt_expression_interface<double>_> *)local_30,
             &local_110);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            (&local_f8,(rt_constant<double,_viennamath::rt_expression_interface<double>_> *)&c6.s,
             &local_a8);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>>
            (&local_f8,(rt_constant<double,_viennamath::rt_expression_interface<double>_> *)&c6.s,
             (rt_variable<viennamath::rt_expression_interface<double>_> *)&y.id_);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>>
            (&local_f8,(rt_constant<double,_viennamath::rt_expression_interface<double>_> *)&c6.s,
             (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)&c6.s);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>>
            (&local_f8,(rt_constant<double,_viennamath::rt_expression_interface<double>_> *)&c6.s,
             (rt_constant<long,_viennamath::rt_expression_interface<double>_> *)local_70);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>>
            (&local_f8,(rt_constant<double,_viennamath::rt_expression_interface<double>_> *)&c6.s,
             (ct_constant<8L> *)((long)&e1.rt_expr_._M_ptr + 7));
  local_118 = 2.7172;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,double>
            (&local_f8,(rt_constant<double,_viennamath::rt_expression_interface<double>_> *)&c6.s,
             &local_118);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            (&local_f8,(rt_constant<long,_viennamath::rt_expression_interface<double>_> *)local_70,
             &local_a8);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>>
            (&local_f8,(rt_constant<long,_viennamath::rt_expression_interface<double>_> *)local_70,
             (rt_variable<viennamath::rt_expression_interface<double>_> *)&y.id_);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>>
            (&local_f8,(rt_constant<long,_viennamath::rt_expression_interface<double>_> *)local_70,
             (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)&c6.s);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>>
            (&local_f8,(rt_constant<long,_viennamath::rt_expression_interface<double>_> *)local_70,
             (rt_constant<long,_viennamath::rt_expression_interface<double>_> *)local_70);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>>
            (&local_f8,(rt_constant<long,_viennamath::rt_expression_interface<double>_> *)local_70,
             (ct_constant<8L> *)((long)&e1.rt_expr_._M_ptr + 7));
  local_120 = 2.7172;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,double>
            (&local_f8,(rt_constant<long,_viennamath::rt_expression_interface<double>_> *)local_70,
             &local_120);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            (&local_f8,(ct_constant<8L> *)((long)&e1.rt_expr_._M_ptr + 7),&local_a8);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>>
            (&local_f8,(ct_constant<8L> *)((long)&e1.rt_expr_._M_ptr + 7),
             (rt_variable<viennamath::rt_expression_interface<double>_> *)&y.id_);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>>
            (&local_f8,(ct_constant<8L> *)((long)&e1.rt_expr_._M_ptr + 7),
             (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)&c6.s);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>>
            (&local_f8,(ct_constant<8L> *)((long)&e1.rt_expr_._M_ptr + 7),
             (rt_constant<long,_viennamath::rt_expression_interface<double>_> *)local_70);
  t = (ct_constant<8L> *)((long)&e1.rt_expr_._M_ptr + 7);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>,viennamath::ct_constant<8l>>
            (&local_f8,t,t);
  local_128 = 2.7172;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>,double>
            (&local_f8,(ct_constant<8L> *)((long)&e1.rt_expr_._M_ptr + 7),&local_128);
  local_130 = 2.7172;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,double,viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            (&local_f8,&local_130,&local_a8);
  local_138 = 2.7172;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,double,viennamath::rt_variable<viennamath::rt_expression_interface<double>>>
            (&local_f8,&local_138,
             (rt_variable<viennamath::rt_expression_interface<double>_> *)&y.id_);
  local_140 = 2.7172;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,double,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>>
            (&local_f8,&local_140,
             (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)&c6.s);
  local_148 = 2.7172;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,double,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>>
            (&local_f8,&local_148,
             (rt_constant<long,_viennamath::rt_expression_interface<double>_> *)local_70);
  local_150 = 2.7172;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,double,viennamath::ct_constant<8l>>
            (&local_f8,&local_150,(ct_constant<8L> *)((long)&e1.rt_expr_._M_ptr + 7));
  local_158 = 2.7172;
  local_160 = 2.7172;
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,double,double>
            (&local_f8,&local_158,&local_160);
  poVar1 = std::operator<<((ostream *)&std::cout,"************************************************")
  ;
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"*****     TEST COMPLETED SUCCESSFULLY!     *****")
  ;
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"************************************************")
  ;
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = viennamath::operator<<
                     ((ostream *)&std::cout,
                      (rt_variable<viennamath::rt_expression_interface<double>_> *)&y.id_);
  poVar1 = std::operator<<(poVar1,": ");
  viennamath::rt_variable<viennamath::rt_expression_interface<double>_>::rt_variable
            (&local_170,(rt_variable<viennamath::rt_expression_interface<double>_> *)&y.id_);
  nVar3 = viennamath::
          eval<viennamath::rt_expression_interface<double>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>>
                    (&local_170,
                     (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)&c6.s);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,nVar3);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  viennamath::rt_variable<viennamath::rt_expression_interface<double>_>::~rt_variable(&local_170);
  poVar1 = viennamath::operator<<((ostream *)&std::cout,&local_a8);
  poVar1 = std::operator<<(poVar1,": ");
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr(&local_178,&local_a8);
  nVar3 = viennamath::
          eval<viennamath::rt_expression_interface<double>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>>
                    (&local_178,
                     (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)&c6.s);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,nVar3);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::~rt_expr(&local_178);
  viennamath::operator+
            (&local_198,(rt_variable<viennamath::rt_expression_interface<double>_> *)&y.id_,
             &local_a8);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator=(&local_f8,&local_198)
  ;
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_198);
  poVar1 = viennamath::operator<<((ostream *)&std::cout,&local_f8);
  poVar1 = std::operator<<(poVar1,": ");
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr(&local_1a0,&local_f8);
  nVar3 = viennamath::
          eval<viennamath::rt_expression_interface<double>,viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>>
                    (&local_1a0,
                     (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)&c6.s);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,nVar3);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::~rt_expr(&local_1a0);
  poVar1 = viennamath::operator<<((ostream *)&std::cout,&local_f8);
  poVar1 = std::operator<<(poVar1,": ");
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr(&local_1a8,&local_f8);
  nVar3 = viennamath::
          eval<viennamath::rt_expression_interface<double>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>>
                    (&local_1a8,
                     (rt_constant<long,_viennamath::rt_expression_interface<double>_> *)local_70);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,nVar3);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::~rt_expr(&local_1a8);
  poVar1 = viennamath::operator<<((ostream *)&std::cout,&local_f8);
  poVar1 = std::operator<<(poVar1,": ");
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr(&local_1b0,&local_f8);
  nVar3 = viennamath::eval<viennamath::rt_expression_interface<double>,viennamath::ct_constant<8l>>
                    (&local_1b0,(ct_constant<8L> *)((long)&e1.rt_expr_._M_ptr + 7));
  pvVar2 = (void *)std::ostream::operator<<(poVar1,nVar3);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::~rt_expr(&local_1b0);
  unary_test<viennamath::rt_variable<viennamath::rt_expression_interface<double>>>
            ((rt_variable<viennamath::rt_expression_interface<double>_> *)&y.id_);
  viennamath::operator+
            (&local_1d0,(rt_variable<viennamath::rt_expression_interface<double>_> *)&y.id_,
             (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)&c6.s);
  unary_test<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>>(&local_1d0);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_1d0);
  viennamath::operator*
            (&local_1f0,(rt_variable<viennamath::rt_expression_interface<double>_> *)local_30,
             (rt_constant<long,_viennamath::rt_expression_interface<double>_> *)local_70);
  unary_test<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>>(&local_1f0);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_1f0);
  viennamath::operator/
            (&local_210,(rt_variable<viennamath::rt_expression_interface<double>_> *)local_30,
             (rt_variable<viennamath::rt_expression_interface<double>_> *)&y.id_);
  unary_test<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>>(&local_210);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_210);
  viennamath::operator+
            (&local_230,(rt_constant<long,_viennamath::rt_expression_interface<double>_> *)local_70,
             (ct_constant<8L> *)((long)&e1.rt_expr_._M_ptr + 7));
  unary_test<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>>(&local_230);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_230);
  viennamath::operator-
            (&local_270,(rt_variable<viennamath::rt_expression_interface<double>_> *)&y.id_,
             (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)&c6.s);
  viennamath::operator-
            (&local_250,&local_270,
             (rt_variable<viennamath::rt_expression_interface<double>_> *)local_30);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator=(&local_f8,&local_250)
  ;
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_250);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_270);
  poVar1 = std::operator<<((ostream *)&std::cout,"Replacing x in ");
  poVar1 = viennamath::operator<<(poVar1,&local_f8);
  poVar1 = std::operator<<(poVar1," with ");
  poVar1 = viennamath::operator<<
                     (poVar1,(rt_constant<long,_viennamath::rt_expression_interface<double>_> *)
                             local_70);
  poVar1 = std::operator<<(poVar1," leads to ");
  viennamath::
  substitute<viennamath::rt_expression_interface<double>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>>
            ((viennamath *)&local_278,
             (rt_variable<viennamath::rt_expression_interface<double>_> *)&y.id_,
             (rt_constant<long,_viennamath::rt_expression_interface<double>_> *)local_70,&local_f8);
  poVar1 = viennamath::operator<<(poVar1,&local_278);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::~rt_expr(&local_278);
  viennamath::exp<viennamath::rt_expression_interface<double>>
            (&local_2d0,(viennamath *)&y.id_,other);
  viennamath::operator-
            (&local_2b8,&local_2d0,
             (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)&c6.s);
  viennamath::operator-
            (&local_298,&local_2b8,
             (rt_variable<viennamath::rt_expression_interface<double>_> *)local_30);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator=(&local_f8,&local_298)
  ;
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_298);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_2b8);
  viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::~rt_unary_expr
            (&local_2d0);
  poVar1 = std::operator<<((ostream *)&std::cout,"Replacing x in ");
  poVar1 = viennamath::operator<<(poVar1,&local_f8);
  poVar1 = std::operator<<(poVar1," with ");
  poVar1 = viennamath::operator<<
                     (poVar1,(rt_constant<long,_viennamath::rt_expression_interface<double>_> *)
                             local_70);
  poVar1 = std::operator<<(poVar1," leads to ");
  viennamath::
  substitute<viennamath::rt_expression_interface<double>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>>
            ((viennamath *)&local_2d8,
             (rt_variable<viennamath::rt_expression_interface<double>_> *)&y.id_,
             (rt_constant<long,_viennamath::rt_expression_interface<double>_> *)local_70,&local_f8);
  poVar1 = viennamath::operator<<(poVar1,&local_2d8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::~rt_expr(&local_2d8);
  poVar1 = std::operator<<((ostream *)&std::cout,"--- Involved types ---");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"x: ");
  poVar1 = viennamath::operator<<
                     (poVar1,(rt_variable<viennamath::rt_expression_interface<double>_> *)&y.id_);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"y: ");
  poVar1 = viennamath::operator<<
                     (poVar1,(rt_variable<viennamath::rt_expression_interface<double>_> *)local_30);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"z: ");
  poVar1 = viennamath::operator<<
                     (poVar1,(rt_variable<viennamath::rt_expression_interface<double>_> *)&c4.s);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"c4: ");
  poVar1 = viennamath::operator<<
                     (poVar1,(rt_constant<double,_viennamath::rt_expression_interface<double>_> *)
                             &c6.s);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"c6: ");
  poVar1 = viennamath::operator<<
                     (poVar1,(rt_constant<long,_viennamath::rt_expression_interface<double>_> *)
                             local_70);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"c8: ");
  poVar1 = viennamath::operator<<(poVar1,(ct_constant<8L> *)((long)&e1.rt_expr_._M_ptr + 7));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"e1: ");
  poVar1 = viennamath::operator<<(poVar1,&local_80);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"e2: ");
  poVar1 = viennamath::operator<<(poVar1,&local_a8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"e3: ");
  poVar1 = viennamath::operator<<(poVar1,&local_d0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"e: ");
  poVar1 = viennamath::operator<<(poVar1,&local_f8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"************************************************")
  ;
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"*****     TEST COMPLETED SUCCESSFULLY!     *****")
  ;
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"************************************************")
  ;
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::~rt_expr(&local_f8);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::~rt_expr(&local_d0);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::~rt_expr(&local_a8);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::~rt_expr(&local_80);
  viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>::~rt_constant
            ((rt_constant<long,_viennamath::rt_expression_interface<double>_> *)local_70);
  viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>::~rt_constant
            ((rt_constant<double,_viennamath::rt_expression_interface<double>_> *)&c6.s);
  viennamath::rt_variable<viennamath::rt_expression_interface<double>_>::~rt_variable
            ((rt_variable<viennamath::rt_expression_interface<double>_> *)&c4.s);
  viennamath::rt_variable<viennamath::rt_expression_interface<double>_>::~rt_variable
            ((rt_variable<viennamath::rt_expression_interface<double>_> *)local_30);
  viennamath::rt_variable<viennamath::rt_expression_interface<double>_>::~rt_variable
            ((rt_variable<viennamath::rt_expression_interface<double>_> *)&y.id_);
  return 0;
}

Assistant:

int main()
{
  viennamath::variable x(0);
  viennamath::variable y(1);
  viennamath::variable z(2);
  viennamath::rt_constant<double> c4(4.0);
  viennamath::rt_constant<long> c6(6);
  viennamath::ct_constant<8> c8;
  viennamath::expr e1 = x + y;
  viennamath::expr e2 = c4 + c8;
  viennamath::expr e3 = e1 + e2;
  viennamath::expr e;

  //compilation checks:
  operations_test(e, e1, e2);
  operations_test(e, e1, x);
  operations_test(e, e1, c4);
  operations_test(e, e1, c6);
  operations_test(e, e1, c8);
  operations_test(e, e1, 2.7172);

  operations_test(e, x, e2);
  operations_test(e, x, x);
  operations_test(e, x, c4);
  operations_test(e, x, c6);
  operations_test(e, x, c8);
  operations_test(e, x, 2.7172);

  operations_test(e, y, e2);
  operations_test(e, y, x);
  operations_test(e, y, c4);
  operations_test(e, y, c6);
  operations_test(e, y, c8);
  operations_test(e, y, 2.7172);

  operations_test(e, c4, e2);
  operations_test(e, c4, x);
  operations_test(e, c4, c4);
  operations_test(e, c4, c6);
  operations_test(e, c4, c8);
  operations_test(e, c4, 2.7172);

  operations_test(e, c6, e2);
  operations_test(e, c6, x);
  operations_test(e, c6, c4);
  operations_test(e, c6, c6);
  operations_test(e, c6, c8);
  operations_test(e, c6, 2.7172);

  operations_test(e, c8, e2);
  operations_test(e, c8, x);
  operations_test(e, c8, c4);
  operations_test(e, c8, c6);
  operations_test(e, c8, c8);
  operations_test(e, c8, 2.7172);

  operations_test(e, 2.7172, e2);
  operations_test(e, 2.7172, x);
  operations_test(e, 2.7172, c4);
  operations_test(e, 2.7172, c6);
  operations_test(e, 2.7172, c8);
  operations_test(e, 2.7172, 2.7172);

  std::cout << "************************************************" << std::endl;
  std::cout << "*****     TEST COMPLETED SUCCESSFULLY!     *****" << std::endl;
  std::cout << "************************************************" << std::endl;
  std::cout << std::endl;


  std::cout << x << ": " << viennamath::eval(x, c4) << std::endl;
  std::cout << e2  << ": " << viennamath::eval(e2, c4) << std::endl;
  e = x + e2;
  std::cout << e << ": " << viennamath::eval(e, c4) << std::endl;
  std::cout << e << ": " << viennamath::eval(e, c6) << std::endl;
  std::cout << e << ": " << viennamath::eval(e, c8) << std::endl;

  unary_test(x);
  unary_test(x+c4);
  unary_test(y*c6);
  unary_test(y/x);
  unary_test(c6+c8);



  e = x - c4 - y;
  std::cout << "Replacing x in " << e
            << " with " << c6
            << " leads to " << viennamath::substitute(x, c6, e) << std::endl;

  e = viennamath::exp(x) - c4 - y;
  std::cout << "Replacing x in " << e
            << " with " << c6
            << " leads to " << viennamath::substitute(x, c6, e) << std::endl;

  std::cout << "--- Involved types ---" << std::endl;
  std::cout << "x: " << x << std::endl;
  std::cout << "y: " << y << std::endl;
  std::cout << "z: " << z << std::endl;
  std::cout << "c4: " << c4 << std::endl;
  std::cout << "c6: " << c6 << std::endl;
  std::cout << "c8: " << c8 << std::endl;
  std::cout << "e1: " << e1 << std::endl;
  std::cout << "e2: " << e2 << std::endl;
  std::cout << "e3: " << e3 << std::endl;
  std::cout << "e: " << e << std::endl;

  std::cout << std::endl;

  std::cout << "************************************************" << std::endl;
  std::cout << "*****     TEST COMPLETED SUCCESSFULLY!     *****" << std::endl;
  std::cout << "************************************************" << std::endl;


  return EXIT_SUCCESS;
}